

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utf8.cpp
# Opt level: O0

void argo::utf8::parse_unicode(string *src,size_t *src_index,string *dst,size_t *dst_index)

{
  size_t sVar1;
  bool bVar2;
  byte bVar3;
  char32_t cVar4;
  char32_t cVar5;
  ulong uVar6;
  char *pcVar7;
  byte *pbVar8;
  json_utf8_exception *this;
  char32_t low_surrogate;
  char32_t high_surrogate;
  char32_t uc;
  size_t *dst_index_local;
  string *dst_local;
  size_t *src_index_local;
  string *src_local;
  
  sVar1 = *src_index;
  uVar6 = std::__cxx11::string::size();
  if (((uVar6 < sVar1 + 10) ||
      (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)src), *pcVar7 != '\\')) ||
     (pcVar7 = (char *)std::__cxx11::string::operator[]((ulong)src), *pcVar7 != 'u')) {
    low_surrogate = parse_hex(src,src_index);
  }
  else {
    cVar4 = parse_hex(src,src_index);
    next_char(src,src_index);
    next_char(src,src_index);
    cVar5 = parse_hex(src,src_index);
    low_surrogate = ((cVar4 + L'\xffff2800') * 0x400 | cVar5 + L'\xffff2400') + L'𐀀';
  }
  bVar2 = valid_unicode(low_surrogate);
  if (bVar2) {
    bVar3 = (byte)low_surrogate;
    if ((uint)low_surrogate < 0x80) {
      *dst_index = *dst_index + 1;
      pbVar8 = (byte *)std::__cxx11::string::operator[]((ulong)dst);
      *pbVar8 = bVar3;
    }
    else if ((uint)low_surrogate < 0x800) {
      set_and_check_unicode_byte(dst,dst_index,(byte)((uint)low_surrogate >> 6) | 0xc0);
      set_and_check_unicode_byte(dst,dst_index,bVar3 & 0x3f | 0x80);
    }
    else if ((uint)low_surrogate < 0x10000) {
      set_and_check_unicode_byte(dst,dst_index,(byte)((uint)low_surrogate >> 0xc) | 0xe0);
      set_and_check_unicode_byte(dst,dst_index,(byte)((uint)low_surrogate >> 6) & 0x3f | 0x80);
      set_and_check_unicode_byte(dst,dst_index,bVar3 & 0x3f | 0x80);
    }
    else {
      set_and_check_unicode_byte(dst,dst_index,(byte)((uint)low_surrogate >> 0x12) | 0xf0);
      set_and_check_unicode_byte(dst,dst_index,(byte)((uint)low_surrogate >> 0xc) & 0x3f | 0x80);
      set_and_check_unicode_byte(dst,dst_index,(byte)((uint)low_surrogate >> 6) & 0x3f | 0x80);
      set_and_check_unicode_byte(dst,dst_index,bVar3 & 0x3f | 0x80);
    }
    return;
  }
  this = (json_utf8_exception *)__cxa_allocate_exception(0xe0);
  json_utf8_exception::json_utf8_exception(this,invalid_unicode_e,low_surrogate);
  __cxa_throw(this,&json_utf8_exception::typeinfo,json_utf8_exception::~json_utf8_exception);
}

Assistant:

void utf8::parse_unicode(
                const string &src, 
                size_t       &src_index, 
                string       &dst,
                size_t       &dst_index)
{
    char32_t uc = 0;

    // is this basic multilingual or a UTF-16 surrogate pair?
    if ((src_index + 10) <= src.size() && 
        src[src_index + 4] == '\\' &&
        src[src_index + 5] == 'u')
    {
        char32_t high_surrogate = parse_hex(src, src_index);

        (void)next_char(src, src_index);
        (void)next_char(src, src_index);

        char32_t low_surrogate = parse_hex(src, src_index);

        uc = ((high_surrogate - 0xD800) << 10 | (low_surrogate - 0xDC00)) + 0x10000;
    }
    else
    {
        uc = parse_hex(src, src_index);
    }

    // I would use the nice new C++11 standard conversion templates for this but
    // they're not fully supported by compilers in the wild just yet.

    if (valid_unicode(uc))
    {
        if (uc < 0x80)
        {
            dst[dst_index++] = static_cast<char>(uc);
        }
        else if (uc < 0x800) 
        {
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc >> 6) | 0xc0));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc & 0x3f) | 0x80));
        }
        else if (uc < 0x10000) 
        {
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc >> 12) | 0xe0));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>(((uc >> 6) & 0x3f) | 0x80));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc & 0x3f) | 0x80));
        }
        else 
        {
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc >> 18) | 0xf0));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>(((uc >> 12) & 0x3f) | 0x80));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>(((uc >> 6) & 0x3f) | 0x80));
            set_and_check_unicode_byte(dst, dst_index, static_cast<char>((uc & 0x3f) | 0x80));
        }
    }
    else
    {
        throw json_utf8_exception(json_utf8_exception::invalid_unicode_e, uc);
    }
}